

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkAfterTrim(Aig_Man_t *pMan,Abc_Ntk_t *pNtkOld)

{
  Vec_Int_t *p;
  Abc_Aig_t *pMan_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  char *pcVar7;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar8;
  Abc_Obj_t *pAVar9;
  int local_54;
  int i;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObj;
  Abc_Obj_t *pObjOld;
  Abc_Obj_t *pObjNew;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtkOld_local;
  Aig_Man_t *pMan_local;
  
  if (pMan->nAsserts != 0) {
    __assert_fail("pMan->nAsserts == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x40a,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  if (pNtkOld->nBarBufs != 0) {
    __assert_fail("pNtkOld->nBarBufs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x40b,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  iVar1 = Aig_ManRegNum(pMan);
  iVar2 = Abc_NtkLatchNum(pNtkOld);
  if (iVar2 < iVar1) {
    __assert_fail("Aig_ManRegNum(pMan) <= Abc_NtkLatchNum(pNtkOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x40c,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  iVar1 = Saig_ManPiNum(pMan);
  iVar2 = Abc_NtkCiNum(pNtkOld);
  if (iVar2 < iVar1) {
    __assert_fail("Saig_ManPiNum(pMan) <= Abc_NtkCiNum(pNtkOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x40d,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  iVar1 = Saig_ManPoNum(pMan);
  iVar2 = Abc_NtkPoNum(pNtkOld);
  if (iVar1 != iVar2) {
    __assert_fail("Saig_ManPoNum(pMan) == Abc_NtkPoNum(pNtkOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x40e,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  if (pMan->vCiNumsOrig == (Vec_Int_t *)0x0) {
    __assert_fail("pMan->vCiNumsOrig != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x40f,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pNtk->nConstrs = pMan->nConstrs;
  pNtk->nBarBufs = pMan->nBarBufs;
  pAVar4 = Abc_AigConst1(pNtk);
  pAVar5 = Aig_ManConst1(pMan);
  (pAVar5->field_5).pData = pAVar4;
  local_54 = 0;
  while( true ) {
    iVar1 = Aig_ManCiNum(pMan);
    iVar2 = Aig_ManRegNum(pMan);
    if (iVar1 - iVar2 <= local_54) break;
    pvVar6 = Vec_PtrEntry(pMan->vCis,local_54);
    pAVar4 = Abc_NtkCreatePi(pNtk);
    *(Abc_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
    iVar1 = Vec_IntEntry(pMan->vCiNumsOrig,local_54);
    pAVar9 = Abc_NtkCi(pNtkOld,iVar1);
    pcVar7 = Abc_ObjName(pAVar9);
    Abc_ObjAssignName(pAVar4,pcVar7,(char *)0x0);
    local_54 = local_54 + 1;
  }
  local_54 = 0;
  while( true ) {
    iVar1 = Aig_ManCoNum(pMan);
    iVar2 = Aig_ManRegNum(pMan);
    if (iVar1 - iVar2 <= local_54) break;
    pvVar6 = Vec_PtrEntry(pMan->vCos,local_54);
    pAVar4 = Abc_NtkCreatePo(pNtk);
    *(Abc_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
    pAVar9 = Abc_NtkCo(pNtkOld,local_54);
    pcVar7 = Abc_ObjName(pAVar9);
    Abc_ObjAssignName(pAVar4,pcVar7,(char *)0x0);
    local_54 = local_54 + 1;
  }
  iVar1 = Abc_NtkCiNum(pNtk);
  iVar2 = Aig_ManCiNum(pMan);
  iVar3 = Aig_ManRegNum(pMan);
  if (iVar1 != iVar2 - iVar3) {
    __assert_fail("Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x42a,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkCoNum(pNtk);
  iVar2 = Aig_ManCoNum(pMan);
  iVar3 = Aig_ManRegNum(pMan);
  if (iVar1 != iVar2 - iVar3) {
    __assert_fail("Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x42b,"Abc_Ntk_t *Abc_NtkAfterTrim(Aig_Man_t *, Abc_Ntk_t *)");
  }
  for (local_54 = 0; iVar1 = Aig_ManRegNum(pMan), local_54 < iVar1; local_54 = local_54 + 1) {
    pAVar5 = Aig_ManLi(pMan,local_54);
    pAVar8 = Aig_ManLo(pMan,local_54);
    pAVar4 = Abc_NtkCreateLatch(pNtk);
    pAVar9 = Abc_NtkCreateBi(pNtk);
    (pAVar5->field_5).pData = pAVar9;
    pAVar9 = Abc_NtkCreateBo(pNtk);
    (pAVar8->field_5).pData = pAVar9;
    Abc_ObjAddFanin(pAVar4,(Abc_Obj_t *)(pAVar5->field_5).pData);
    Abc_ObjAddFanin((Abc_Obj_t *)(pAVar8->field_5).pData,pAVar4);
    Abc_LatchSetInit0(pAVar4);
    p = pMan->vCiNumsOrig;
    iVar1 = Saig_ManPiNum(pMan);
    iVar1 = Vec_IntEntry(p,iVar1 + local_54);
    pAVar9 = Abc_NtkCi(pNtkOld,iVar1);
    pAVar4 = (Abc_Obj_t *)(pAVar8->field_5).pData;
    pcVar7 = Abc_ObjName(pAVar9);
    Abc_ObjAssignName(pAVar4,pcVar7,(char *)0x0);
    iVar1 = Saig_ManPoNum(pMan);
    pAVar9 = Abc_NtkCo(pNtkOld,iVar1 + local_54);
    pAVar4 = (Abc_Obj_t *)(pAVar5->field_5).pData;
    pcVar7 = Abc_ObjName(pAVar9);
    Abc_ObjAssignName(pAVar4,pcVar7,(char *)0x0);
  }
  p_00 = Aig_ManDfs(pMan,1);
  for (local_54 = 0; iVar1 = Vec_PtrSize(p_00), local_54 < iVar1; local_54 = local_54 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_54);
    iVar1 = Aig_ObjIsBuf(pAVar5);
    if (iVar1 == 0) {
      pMan_00 = (Abc_Aig_t *)pNtk->pManFunc;
      pAVar4 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar5);
      pAVar9 = (Abc_Obj_t *)Aig_ObjChild1Copy(pAVar5);
      pAVar4 = Abc_AigAnd(pMan_00,pAVar4,pAVar9);
      (pAVar5->field_5).pData = pAVar4;
    }
    else {
      pAVar8 = Aig_ObjChild0Copy(pAVar5);
      (pAVar5->field_5).pData = pAVar8;
    }
  }
  Vec_PtrFree(p_00);
  for (local_54 = 0; iVar1 = Vec_PtrSize(pMan->vCos), local_54 < iVar1; local_54 = local_54 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vCos,local_54);
    pAVar4 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar5);
    pAVar9 = Abc_NtkCo(pNtk,local_54);
    Abc_ObjAddFanin(pAVar9,pAVar4);
  }
  iVar1 = Abc_NtkCheck(pNtk);
  if (iVar1 == 0) {
    Abc_Print(1,"Abc_NtkAfterTrim(): Network check has failed.\n");
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkAfterTrim( Aig_Man_t * pMan, Abc_Ntk_t * pNtkOld )
{
    Vec_Ptr_t * vNodes; 
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjNew, * pObjOld;
    Aig_Obj_t * pObj, * pObjLo, * pObjLi;
    int i; 
    assert( pMan->nAsserts == 0 );
    assert( pNtkOld->nBarBufs == 0 );
    assert( Aig_ManRegNum(pMan) <= Abc_NtkLatchNum(pNtkOld) );
    assert( Saig_ManPiNum(pMan) <= Abc_NtkCiNum(pNtkOld) );
    assert( Saig_ManPoNum(pMan) == Abc_NtkPoNum(pNtkOld) );
    assert( pMan->vCiNumsOrig != NULL );
    // perform strashing
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkNew->nConstrs = pMan->nConstrs;
    pNtkNew->nBarBufs = pMan->nBarBufs;
    // duplicate the name and the spec
//    pNtkNew->pName = Extra_UtilStrsav(pMan->pName);
//    pNtkNew->pSpec = Extra_UtilStrsav(pMan->pSpec);
    Aig_ManConst1(pMan)->pData = Abc_AigConst1(pNtkNew);
    // create PIs
    Aig_ManForEachPiSeq( pMan, pObj, i )
    {
        pObjNew = Abc_NtkCreatePi( pNtkNew );
        pObj->pData = pObjNew;
        // find the name
        pObjOld = Abc_NtkCi( pNtkOld, Vec_IntEntry(pMan->vCiNumsOrig, i) );
        Abc_ObjAssignName( pObjNew, Abc_ObjName(pObjOld), NULL );
    }
    // create POs
    Aig_ManForEachPoSeq( pMan, pObj, i )
    {
        pObjNew = Abc_NtkCreatePo( pNtkNew );
        pObj->pData = pObjNew;
        // find the name
        pObjOld = Abc_NtkCo( pNtkOld, i );
        Abc_ObjAssignName( pObjNew, Abc_ObjName(pObjOld), NULL );
    }
    assert( Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan) );
    assert( Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) );
    // create as many latches as there are registers in the manager
    Aig_ManForEachLiLoSeq( pMan, pObjLi, pObjLo, i )
    {
        pObjNew = Abc_NtkCreateLatch( pNtkNew );
        pObjLi->pData = Abc_NtkCreateBi( pNtkNew );
        pObjLo->pData = Abc_NtkCreateBo( pNtkNew );
        Abc_ObjAddFanin( pObjNew, (Abc_Obj_t *)pObjLi->pData );
        Abc_ObjAddFanin( (Abc_Obj_t *)pObjLo->pData, pObjNew );
        Abc_LatchSetInit0( pObjNew );
        // find the name
        pObjOld = Abc_NtkCi( pNtkOld, Vec_IntEntry(pMan->vCiNumsOrig, Saig_ManPiNum(pMan)+i) );
        Abc_ObjAssignName( (Abc_Obj_t *)pObjLo->pData, Abc_ObjName(pObjOld), NULL );
        // find the name
        pObjOld = Abc_NtkCo( pNtkOld, Saig_ManPoNum(pMan)+i );
        Abc_ObjAssignName( (Abc_Obj_t *)pObjLi->pData, Abc_ObjName(pObjOld), NULL );
    }
    // rebuild the AIG
    vNodes = Aig_ManDfs( pMan, 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsBuf(pObj) )
            pObj->pData = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        else
            pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, (Abc_Obj_t *)Aig_ObjChild0Copy(pObj), (Abc_Obj_t *)Aig_ObjChild1Copy(pObj) );
    Vec_PtrFree( vNodes );
    // connect the PO nodes
    Aig_ManForEachCo( pMan, pObj, i )
    {
        pObjNew = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), pObjNew );
    }
    // check the resulting AIG
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkAfterTrim(): Network check has failed.\n" );
    return pNtkNew;
}